

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O1

string * __thiscall
flatbuffers::SimpleFloatConstantGenerator::Value
          (string *__return_storage_ptr__,SimpleFloatConstantGenerator *this,double v,string *src)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (src->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + src->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string SimpleFloatConstantGenerator::Value(double v,
                                                const std::string &src) const {
  (void)v;
  return src;
}